

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CColorConverter.cpp
# Opt level: O0

void irr::video::CColorConverter::convert8BitTo24Bit
               (u8 *in,u8 *out,s32 width,s32 height,u8 *palette,s32 linepad,bool flip)

{
  int iVar1;
  s32 x;
  s32 y;
  s32 lineWidth;
  bool flip_local;
  s32 linepad_local;
  u8 *palette_local;
  s32 height_local;
  s32 width_local;
  u8 *out_local;
  u8 *in_local;
  
  if ((in != (u8 *)0x0) && (out != (u8 *)0x0)) {
    iVar1 = width * 3;
    out_local = out;
    if (flip) {
      out_local = out + iVar1 * height;
    }
    in_local = in;
    for (y = 0; y < height; y = y + 1) {
      if (flip) {
        out_local = out_local + -(long)iVar1;
      }
      for (x = 0; x < iVar1; x = x + 3) {
        if (palette == (u8 *)0x0) {
          out_local[x] = *in_local;
          out_local[x + 1] = *in_local;
          out_local[x + 2] = *in_local;
        }
        else {
          out_local[x] = palette[(int)((uint)*in_local * 4 + 2)];
          out_local[x + 1] = palette[(int)((uint)*in_local * 4 + 1)];
          out_local[x + 2] = palette[(int)((uint)*in_local << 2)];
        }
        in_local = in_local + 1;
      }
      if (!flip) {
        out_local = out_local + iVar1;
      }
      in_local = in_local + linepad;
    }
  }
  return;
}

Assistant:

void CColorConverter::convert8BitTo24Bit(const u8 *in, u8 *out, s32 width, s32 height, const u8 *palette, s32 linepad, bool flip)
{
	if (!in || !out)
		return;

	const s32 lineWidth = 3 * width;
	if (flip)
		out += lineWidth * height;

	for (s32 y = 0; y < height; ++y) {
		if (flip)
			out -= lineWidth; // one line back
		for (s32 x = 0; x < lineWidth; x += 3) {
			if (palette) {
#ifdef __BIG_ENDIAN__
				out[x + 0] = palette[(in[0] << 2) + 0];
				out[x + 1] = palette[(in[0] << 2) + 1];
				out[x + 2] = palette[(in[0] << 2) + 2];
#else
				out[x + 0] = palette[(in[0] << 2) + 2];
				out[x + 1] = palette[(in[0] << 2) + 1];
				out[x + 2] = palette[(in[0] << 2) + 0];
#endif
			} else {
				out[x + 0] = in[0];
				out[x + 1] = in[0];
				out[x + 2] = in[0];
			}
			++in;
		}
		if (!flip)
			out += lineWidth;
		in += linepad;
	}
}